

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncCapabilityStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:209:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncCapabilityStream>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:209:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  Own<kj::AsyncCapabilityStream> *pOVar1;
  Disposer *pDVar2;
  AsyncCapabilityStream *pAVar3;
  AsyncCapabilityStream *pAVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t sVar10;
  ExceptionOr<kj::Own<kj::AsyncCapabilityStream>_> depResult;
  ExceptionOr<kj::Promise<void>_> local_5d0;
  ExceptionOrValue local_458;
  Disposer *local_2f8;
  AsyncCapabilityStream *pAStack_2f0;
  Exception local_2e8;
  Exception local_188;
  
  local_458.exception.ptr.isSet = false;
  local_2f8 = (Disposer *)0x0;
  pAStack_2f0 = (AsyncCapabilityStream *)0x0;
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_458);
  pAVar4 = pAStack_2f0;
  uVar9 = local_458.exception.ptr.field_1.value.context.ptr.ptr;
  uVar8 = local_458.exception.ptr.field_1.value.description.content.size_;
  uVar7 = local_458.exception.ptr.field_1.value.description.content.ptr;
  uVar6 = local_458.exception.ptr.field_1.value.ownFile.content.size_;
  uVar5 = local_458.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_458.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_458.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.ptr = local_458.exception.ptr.field_1.value.ownFile.content.ptr;
    local_188.ownFile.content.size_ = local_458.exception.ptr.field_1.value.ownFile.content.size_;
    local_188.ownFile.content.disposer =
         local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_458.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_458.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_458.exception.ptr.field_1.value.file;
    local_188.line = local_458.exception.ptr.field_1.value.line;
    local_188.type = local_458.exception.ptr.field_1.value.type;
    local_188.description.content.ptr =
         local_458.exception.ptr.field_1.value.description.content.ptr;
    local_188.description.content.size_ =
         local_458.exception.ptr.field_1.value.description.content.size_;
    local_188.description.content.disposer =
         local_458.exception.ptr.field_1.value.description.content.disposer;
    local_458.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_458.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = local_458.exception.ptr.field_1.value.context.ptr.ptr;
    local_458.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2e8.ownFile.content.ptr = (char *)uVar5;
    local_2e8.ownFile.content.size_ = uVar6;
    local_2e8.ownFile.content.disposer =
         local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2e8.file = local_458.exception.ptr.field_1.value.file;
    local_2e8.line = local_458.exception.ptr.field_1.value.line;
    local_2e8.type = local_458.exception.ptr.field_1.value.type;
    local_2e8.description.content.ptr = (char *)uVar7;
    local_2e8.description.content.size_ = uVar8;
    local_2e8.description.content.disposer =
         local_458.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = (Context *)uVar9;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_5d0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar5
    ;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar6;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_458.exception.ptr.field_1.value.file;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_458.exception.ptr.field_1._32_8_;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar7;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar8;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_458.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar9;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5d0.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5d0.value.ptr.isSet = false;
    Exception::~Exception(&local_2e8);
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_5d0)
    ;
    uVar5 = local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d0.value.ptr.isSet == true) &&
       (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar5)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar5)->_vptr_PromiseNode[-2]));
    }
    if (local_5d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_188);
  }
  else if (pAStack_2f0 != (AsyncCapabilityStream *)0x0) {
    pAStack_2f0 = (AsyncCapabilityStream *)0x0;
    pOVar1 = (this->func).receivedStream;
    pDVar2 = pOVar1->disposer;
    pAVar3 = pOVar1->ptr;
    pOVar1->disposer = local_2f8;
    pOVar1->ptr = pAVar4;
    if (pAVar3 != (AsyncCapabilityStream *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&(pAVar3->super_AsyncIoStream).super_AsyncInputStream.
                                _vptr_AsyncInputStream +
                        (long)(pAVar3->super_AsyncIoStream).super_AsyncInputStream.
                              _vptr_AsyncInputStream[-2]));
    }
    pAVar4 = ((this->func).receivedStream)->ptr;
    (**(pAVar4->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream)
              (&local_2e8,&(pAVar4->super_AsyncIoStream).super_AsyncOutputStream,"bar",3);
    local_5d0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5d0.value.ptr.isSet = true;
    local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_2e8.ownFile.content.ptr;
    local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_2e8.ownFile.content.size_;
    local_2e8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_5d0)
    ;
    uVar5 = local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d0.value.ptr.isSet == true) &&
       (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar5)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar5)->_vptr_PromiseNode[-2]));
    }
    if (local_5d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    sVar10 = local_2e8.ownFile.content.size_;
    if ((PromiseNode *)local_2e8.ownFile.content.size_ != (PromiseNode *)0x0) {
      local_2e8.ownFile.content.size_ = 0;
      (***(_func_int ***)local_2e8.ownFile.content.ptr)
                (local_2e8.ownFile.content.ptr,
                 (_func_int *)((long)(_func_int ***)sVar10 + (long)(*(_func_int ***)sVar10)[-2]));
    }
  }
  pAVar4 = pAStack_2f0;
  if (pAStack_2f0 != (AsyncCapabilityStream *)0x0) {
    pAStack_2f0 = (AsyncCapabilityStream *)0x0;
    (**local_2f8->_vptr_Disposer)
              (local_2f8,
               (_func_int *)
               ((long)&(pAVar4->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream +
               (long)(pAVar4->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[-2]
               ));
  }
  if (local_458.exception.ptr.isSet == true) {
    Exception::~Exception(&local_458.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }